

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O2

bool __thiscall QPathEdit::setPath(QPathEdit *this,QString *path,bool allowInvalid)

{
  bool bVar1;
  int iVar2;
  QString *pQVar3;
  bool bVar4;
  QArrayDataPointer<char16_t> local_b8;
  int pseudo;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  QLineEdit::text();
  bVar1 = operator==((QString *)&local_58,path);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  bVar4 = true;
  if (!bVar1) {
    if (allowInvalid) {
      QLineEdit::setText((QString *)this->edit);
    }
    pseudo = 0;
    iVar2 = (**(code **)(*(long *)this->pathValidator + 0x60))(this->pathValidator,path);
    bVar4 = iVar2 == 2;
    if (bVar4) {
      local_58.d = (Data *)0x0;
      local_58.ptr = L"\\";
      local_58.size = 1;
      local_78.size = 0;
      local_40.d = (Data *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_40.ptr = L"/";
      local_40.size = 1;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      pQVar3 = (QString *)
               QString::replace((QString *)path,(QString *)&local_58,(CaseSensitivity)&local_40);
      QString::operator=(&this->currentValidPath,pQVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      if (!allowInvalid) {
        QLineEdit::setText((QString *)this->edit);
      }
      local_b8.d = (path->d).d;
      local_b8.ptr = (path->d).ptr;
      local_b8.size = (path->d).size;
      if (local_b8.d != (Data *)0x0) {
        LOCK();
        ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pathChanged(this,(QString *)&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
  }
  return bVar4;
}

Assistant:

bool QPathEdit::setPath(QString path, bool allowInvalid) {
    if (edit->text() == path) {
		return true;
    }

    if(allowInvalid) {
		edit->setText(path);
    }

	int pseudo = 0;
	if(pathValidator->validate(path, pseudo) == QValidator::Acceptable) {
		currentValidPath = path.replace(QStringLiteral("\\"), QStringLiteral("/"));
        if(!allowInvalid) {
			edit->setText(path);
        }
		emit pathChanged(path);
		return true;
    } else {
		return false;
    }
}